

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O2

void choice_dialog_stop_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Object local_30;
  Am_Object widget;
  Am_Object local_20;
  Am_Value return_value;
  
  Am_Object::Get_Owner((Am_Object *)&return_value,(Am_Slot_Flags)cmd);
  pAVar1 = Am_Object::Get((Am_Object *)&return_value,0x68,0);
  Am_Object::Am_Object(&widget,pAVar1);
  Am_Object::~Am_Object((Am_Object *)&return_value);
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)&widget,0x1ec);
  Am_Object::Get_Object(&local_30,(Am_Slot_Key)&local_20,0x1ea);
  pAVar1 = Am_Object::Get(&local_30,0x169,0);
  Am_Value::Am_Value(&return_value,pAVar1);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_20);
  Am_Object::Get_Object(&local_30,(Am_Slot_Key)&widget,0xc5);
  Am_Object::Set(&local_30,0x169,&return_value,0);
  Am_Object::~Am_Object(&local_30);
  Am_Value::~Am_Value(&return_value);
  Am_Object::~Am_Object(&widget);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, choice_dialog_stop, (Am_Object cmd))
{
  Am_Object widget = cmd.Get_Owner().Get(Am_WINDOW);
  Am_Value return_value = widget.Get_Object(Am_DIALOG_GROUP)
                              .Get_Object(Am_DIALOG_BUTTONS)
                              .Get(Am_VALUE);
  widget.Get_Object(Am_COMMAND).Set(Am_VALUE, return_value);
}